

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

void __thiscall Worker::run_tasks(Worker *this)

{
  bool bVar1;
  reference ppCVar2;
  SharedBarrier *this_00;
  __normal_iterator<Container_**,_std::vector<Container_*,_std::allocator<Container_*>_>_> *__rhs;
  Container *container;
  iterator __end1;
  iterator __begin1;
  vector<Container_*,_std::allocator<Container_*>_> *__range1;
  Worker *this_local;
  
  __end1 = std::vector<Container_*,_std::allocator<Container_*>_>::begin(&this->containers_);
  container = (Container *)
              std::vector<Container_*,_std::allocator<Container_*>_>::end(&this->containers_);
  while( true ) {
    __rhs = (__normal_iterator<Container_**,_std::vector<Container_*,_std::allocator<Container_*>_>_>
             *)&container;
    bVar1 = __gnu_cxx::operator!=(&__end1,__rhs);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<Container_**,_std::vector<Container_*,_std::allocator<Container_*>_>_>
              ::operator*(&__end1);
    this_00 = Container::get_barrier(*ppCVar2);
    SharedBarrier::wait(this_00,__rhs);
    __gnu_cxx::
    __normal_iterator<Container_**,_std::vector<Container_*,_std::allocator<Container_*>_>_>::
    operator++(&__end1);
  }
  SharedBarrier::wait(&this->run_start_barrier_,__rhs);
  return;
}

Assistant:

void Worker::run_tasks() {
    // Containers are wait()ing for tasks on their barriers
    for (auto *container : containers_) {
        container->get_barrier()->wait();
    }
    // Wait for run start
    run_start_barrier_.wait();
}